

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void duckdb::SortedAggregateFunction::Finalize
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  vector<duckdb::LogicalType,_true> *__x;
  bool bVar1;
  aggregate_update_t p_Var2;
  aggregate_destructor_t p_Var3;
  aggregate_simple_update_t p_Var4;
  value_type vVar5;
  pointer pBVar6;
  SortedAggregateState *this;
  __uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_> _Var7;
  int iVar8;
  SortedAggregateBindData *order_bind;
  BufferManager *pBVar9;
  undefined4 extraout_var;
  idx_t iVar10;
  reference pvVar11;
  pointer pGVar12;
  pointer pLVar13;
  type pGVar14;
  reference pvVar15;
  type pLVar16;
  pointer pPVar17;
  reference other;
  ulong uVar18;
  pointer *__ptr;
  ulong __n;
  ulong uVar19;
  column_t col_idx;
  size_type __n_00;
  ulong __n_01;
  pointer this_00;
  templated_unique_single_t global_sort;
  templated_unique_single_t local_sort;
  ulong local_2e0;
  __uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_> local_2d8;
  ulong local_2d0;
  Vector *local_2c8;
  Vector *local_2c0;
  _Head_base<0UL,_duckdb::GlobalSortState_*,_false> local_2b8;
  aggregate_finalize_t local_2b0;
  idx_t local_2a8;
  aggregate_initialize_t local_2a0;
  AggregateFunction *local_298;
  ClientContext *local_290;
  data_ptr_t local_288;
  AggregateInputData aggr_bind_info;
  vector<duckdb::BoundOrderByNode,_true> orders;
  vector<unsigned_char,_true> agg_state;
  vector<unsigned_long,_true> state_unprocessed;
  DataChunk prefixed;
  DataChunk sliced;
  DataChunk chunk;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_148;
  templated_unique_single_t scanner;
  Vector agg_state_vec;
  RowLayout payload_layout;
  Allocator *allocator;
  
  local_2c8 = result;
  local_2c0 = states;
  local_2a8 = offset;
  order_bind = (SortedAggregateBindData *)
               optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  local_290 = order_bind->context;
  RowLayout::RowLayout(&payload_layout);
  __x = &order_bind->arg_types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_148,
             &__x->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(&payload_layout,(vector<duckdb::LogicalType,_true> *)&local_148,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_148);
  pBVar9 = BufferManager::GetBufferManager(order_bind->context);
  iVar8 = (*pBVar9->_vptr_BufferManager[0x14])(pBVar9);
  allocator = (Allocator *)CONCAT44(extraout_var,iVar8);
  DataChunk::DataChunk(&chunk);
  DataChunk::Initialize(&chunk,allocator,__x,0x800);
  DataChunk::DataChunk(&sliced);
  DataChunk::Initialize(&sliced,allocator,__x,0x800);
  local_298 = &order_bind->function;
  iVar10 = (*(order_bind->function).state_size)(local_298);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&agg_state.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar10,
             (allocator_type *)&agg_state_vec);
  Value::POINTER((Value *)&prefixed,
                 (uintptr_t)
                 agg_state.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  Vector::Vector(&agg_state_vec,(Value *)&prefixed);
  Value::~Value((Value *)&prefixed);
  aggr_bind_info.bind_data.ptr =
       (order_bind->bind_info).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  aggr_bind_info.allocator = aggr_input_data->allocator;
  aggr_bind_info.combine_type = PRESERVE_INPUT;
  local_2a0 = (order_bind->function).initialize;
  p_Var2 = (order_bind->function).update;
  p_Var3 = (order_bind->function).destructor;
  p_Var4 = (order_bind->function).simple_update;
  local_2b0 = (order_bind->function).finalize;
  local_288 = local_2c0->data;
  prefixed.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&state_unprocessed,count,
             (value_type_conflict1 *)&prefixed,(allocator_type *)&scanner);
  for (__n_00 = 0; count != __n_00; __n_00 = __n_00 + 1) {
    vVar5 = **(value_type **)(local_288 + __n_00 * 8);
    pvVar11 = vector<unsigned_long,_true>::get<true>(&state_unprocessed,__n_00);
    *pvVar11 = vVar5;
  }
  orders.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  orders.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  orders.super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::USMALLINT((Value *)&prefixed,0);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
            ((duckdb *)&global_sort,(Value *)&prefixed);
  local_2b8._M_head_impl = (GlobalSortState *)global_sort;
  global_sort.
  super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>.
  super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>)
       (__uniq_ptr_data<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true,_true>
        )0x0;
  BoundOrderByNode::BoundOrderByNode
            ((BoundOrderByNode *)&scanner,ASCENDING,NULLS_FIRST,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2b8);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            (&orders.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
             (BoundOrderByNode *)&scanner);
  BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&scanner);
  if (local_2b8._M_head_impl != (GlobalSortState *)0x0) {
    (*(code *)((local_2b8._M_head_impl)->context->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  local_2b8._M_head_impl = (GlobalSortState *)0x0;
  if (global_sort.
      super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t.
      super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
      .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)global_sort.
                          super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
                          .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl + 8)
    )();
  }
  global_sort.
  super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>.
  super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>)
       (__uniq_ptr_data<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true,_true>
        )0x0;
  Value::~Value((Value *)&prefixed);
  pBVar6 = (order_bind->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (order_bind->orders).
                 super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                 super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pBVar6; this_00 = this_00 + 1
      ) {
    BoundOrderByNode::Copy((BoundOrderByNode *)&prefixed,this_00);
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
    emplace_back<duckdb::BoundOrderByNode>
              (&orders.
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
               (BoundOrderByNode *)&prefixed);
    BoundOrderByNode::~BoundOrderByNode((BoundOrderByNode *)&prefixed);
  }
  make_uniq<duckdb::GlobalSortState,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>&,duckdb::RowLayout&>
            ((duckdb *)&global_sort,local_290,&orders,&payload_layout);
  bVar1 = order_bind->external;
  pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator->(&global_sort);
  pGVar12->external = bVar1;
  make_uniq<duckdb::LocalSortState>();
  pLVar13 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
            operator->(&local_sort);
  pGVar14 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator*(&global_sort);
  pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator->(&global_sort);
  LocalSortState::Initialize(pLVar13,pGVar14,pGVar12->buffer_manager);
  DataChunk::DataChunk(&prefixed);
  pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator->(&global_sort);
  DataChunk::Initialize(&prefixed,allocator,&(pGVar12->sort_layout).logical_types,0x800);
  local_2e0 = 0;
  __n = 0;
  local_2d0 = 0;
  do {
    uVar18 = local_2d0;
    do {
      if (count <= uVar18) goto LAB_016c84b2;
      if (order_bind->threshold <= local_2e0) break;
      this = *(SortedAggregateState **)(local_288 + uVar18 * 8);
      DataChunk::Reset(&prefixed);
      pvVar15 = vector<duckdb::Vector,_true>::get<true>(&prefixed.data,0);
      Value::USMALLINT((Value *)&scanner,(uint16_t)uVar18);
      Vector::Reference(pvVar15,(Value *)&scanner);
      Value::~Value((Value *)&scanner);
      pLVar16 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                ::operator*(&local_sort);
      SortedAggregateState::Finalize(this,order_bind,&prefixed,pLVar16);
      pvVar11 = vector<unsigned_long,_true>::get<true>(&state_unprocessed,uVar18);
      local_2e0 = local_2e0 + *pvVar11;
      uVar18 = uVar18 + 1;
    } while (uVar18 < count);
    local_2d0 = uVar18;
    if (local_2e0 == 0) break;
    pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator->(&global_sort);
    pLVar16 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
              ::operator*(&local_sort);
    GlobalSortState::AddLocalState(pGVar12,pLVar16);
    pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator->(&global_sort);
    GlobalSortState::PrepareMergePhase(pGVar12);
    while (pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                     ::operator->(&global_sort),
          8 < (ulong)((long)(pGVar12->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar12->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
      pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&global_sort);
      GlobalSortState::InitializeMergeRound(pGVar12);
      pGVar14 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator*(&global_sort);
      pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&global_sort);
      MergeSorter::MergeSorter((MergeSorter *)&scanner,pGVar14,pGVar12->buffer_manager);
      MergeSorter::PerformInMergeRound((MergeSorter *)&scanner);
      pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&global_sort);
      GlobalSortState::CompleteMergeRound(pGVar12,false);
      MergeSorter::~MergeSorter((MergeSorter *)&scanner);
    }
    pGVar14 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator*(&global_sort);
    make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&>((duckdb *)&scanner,pGVar14);
    (*local_2a0)(local_298,
                 agg_state.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    while( true ) {
      pPVar17 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                              *)&scanner);
      iVar10 = PayloadScanner::Remaining(pPVar17);
      if (iVar10 == 0) break;
      DataChunk::Reset(&chunk);
      pPVar17 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                              *)&scanner);
      PayloadScanner::Scan(pPVar17,&chunk);
      uVar18 = 0;
      while (uVar18 < chunk.count) {
        while (pvVar11 = vector<unsigned_long,_true>::get<true>(&state_unprocessed,__n),
              *pvVar11 == 0) {
          Vector::SetVectorType(&agg_state_vec,local_2c0->vector_type);
          (*local_2b0)(&agg_state_vec,&aggr_bind_info,local_2c8,1,local_2a8 + __n);
          if (p_Var3 != (aggregate_destructor_t)0x0) {
            (*p_Var3)(&agg_state_vec,&aggr_bind_info,1);
          }
          (*local_2a0)(local_298,
                       agg_state.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
          __n = __n + 1;
        }
        pvVar11 = vector<unsigned_long,_true>::get<true>(&state_unprocessed,__n);
        uVar19 = chunk.count - uVar18;
        if (*pvVar11 < chunk.count - uVar18) {
          uVar19 = *pvVar11;
        }
        for (__n_01 = 0;
            __n_01 < (ulong)(((long)chunk.data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)chunk.data.
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x68);
            __n_01 = __n_01 + 1) {
          pvVar15 = vector<duckdb::Vector,_true>::get<true>(&sliced.data,__n_01);
          other = vector<duckdb::Vector,_true>::get<true>(&chunk.data,__n_01);
          Vector::Slice(pvVar15,other,uVar18,uVar18 + uVar19);
        }
        sliced.count = uVar19;
        if (p_Var4 == (aggregate_simple_update_t)0x0) {
          Vector::SetVectorType(&agg_state_vec,CONSTANT_VECTOR);
          (*p_Var2)(sliced.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start,&aggr_bind_info,
                    ((long)sliced.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)sliced.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x68,&agg_state_vec,
                    sliced.count);
        }
        else {
          (*p_Var4)(sliced.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start,&aggr_bind_info,
                    ((long)sliced.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                           .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)sliced.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x68,
                    agg_state.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,uVar19);
        }
        pvVar11 = vector<unsigned_long,_true>::get<true>(&state_unprocessed,__n);
        *pvVar11 = *pvVar11 - uVar19;
        uVar18 = uVar18 + uVar19;
      }
    }
    Vector::SetVectorType(&agg_state_vec,local_2c0->vector_type);
    (*local_2b0)(&agg_state_vec,&aggr_bind_info,local_2c8,1,local_2a8 + __n);
    if (p_Var3 != (aggregate_destructor_t)0x0) {
      (*p_Var3)(&agg_state_vec,&aggr_bind_info,1);
    }
    if (local_2d0 < count) {
      ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *
            )&scanner,(pointer)0x0);
      make_uniq<duckdb::GlobalSortState,duckdb::ClientContext&,duckdb::vector<duckdb::BoundOrderByNode,true>&,duckdb::RowLayout&>
                ((duckdb *)&local_2d8,local_290,&orders,&payload_layout);
      _Var7._M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
      .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl =
           local_2d8._M_t.
           super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
           .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl;
      local_2d8._M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
      .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl =
           (tuple<duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>)
           (_Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
           )0x0;
      ::std::__uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
      ::reset((__uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
               *)&global_sort,
              (pointer)_Var7._M_t.
                       super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
                       .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl);
      ::std::unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>::
      ~unique_ptr((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
                   *)&local_2d8);
      bVar1 = order_bind->external;
      pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&global_sort);
      pGVar12->external = bVar1;
      make_uniq<duckdb::LocalSortState>();
      _Var7._M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
      .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl =
           local_2d8._M_t.
           super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
           .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl;
      local_2d8._M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
      .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl =
           (tuple<duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>)
           (_Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
           )0x0;
      ::std::__uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>::
      reset((__uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_> *
            )&local_sort,
            (pointer)_Var7._M_t.
                     super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
                     .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl);
      ::std::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>::
      ~unique_ptr((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>
                   *)&local_2d8);
      pLVar13 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                ::operator->((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                              *)&local_sort);
      pGVar14 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator*(&global_sort);
      pGVar12 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&global_sort);
      LocalSortState::Initialize(pLVar13,pGVar14,pGVar12->buffer_manager);
      local_2e0 = 0;
    }
    __n = __n + 1;
    ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
    ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
                &scanner);
  } while (local_2d0 < count);
LAB_016c84b2:
  for (; __n < count; __n = __n + 1) {
    (*local_2a0)(local_298,
                 agg_state.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    Vector::SetVectorType(&agg_state_vec,local_2c0->vector_type);
    (*local_2b0)(&agg_state_vec,&aggr_bind_info,local_2c8,1,local_2a8 + __n);
    if (p_Var3 != (aggregate_destructor_t)0x0) {
      (*p_Var3)(&agg_state_vec,&aggr_bind_info,1);
    }
  }
  Vector::Verify(local_2c8,count);
  DataChunk::~DataChunk(&prefixed);
  ::std::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>::
  ~unique_ptr(&local_sort.
               super_unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>
             );
  ::std::unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>::
  ~unique_ptr(&global_sort.
               super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
             );
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&orders.
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&state_unprocessed);
  Vector::~Vector(&agg_state_vec);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&agg_state);
  DataChunk::~DataChunk(&sliced);
  DataChunk::~DataChunk(&chunk);
  RowLayout::~RowLayout(&payload_layout);
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     const idx_t offset) {
		auto &order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		auto &context = order_bind.context;
		RowLayout payload_layout;
		payload_layout.Initialize(order_bind.arg_types);

		auto &buffer_allocator = BufferManager::GetBufferManager(order_bind.context).GetBufferAllocator();
		DataChunk chunk;
		chunk.Initialize(buffer_allocator, order_bind.arg_types);
		DataChunk sliced;
		sliced.Initialize(buffer_allocator, order_bind.arg_types);

		//	 Reusable inner state
		auto &aggr = order_bind.function;
		vector<data_t> agg_state(aggr.state_size(aggr));
		Vector agg_state_vec(Value::POINTER(CastPointerToValue(agg_state.data())));

		// State variables
		auto bind_info = order_bind.bind_info.get();
		AggregateInputData aggr_bind_info(bind_info, aggr_input_data.allocator);

		// Inner aggregate APIs
		auto initialize = aggr.initialize;
		auto destructor = aggr.destructor;
		auto simple_update = aggr.simple_update;
		auto update = aggr.update;
		auto finalize = aggr.finalize;

		auto sdata = FlatVector::GetData<SortedAggregateState *>(states);

		vector<idx_t> state_unprocessed(count, 0);
		for (idx_t i = 0; i < count; ++i) {
			state_unprocessed[i] = sdata[i]->count;
		}

		// Sort the input payloads on (state_idx ASC, orders)
		vector<BoundOrderByNode> orders;
		orders.emplace_back(BoundOrderByNode(OrderType::ASCENDING, OrderByNullType::NULLS_FIRST,
		                                     make_uniq<BoundConstantExpression>(Value::USMALLINT(0))));
		for (const auto &order : order_bind.orders) {
			orders.emplace_back(order.Copy());
		}

		auto global_sort = make_uniq<GlobalSortState>(context, orders, payload_layout);
		global_sort->external = order_bind.external;
		auto local_sort = make_uniq<LocalSortState>();
		local_sort->Initialize(*global_sort, global_sort->buffer_manager);

		DataChunk prefixed;
		prefixed.Initialize(buffer_allocator, global_sort->sort_layout.logical_types);

		//	Go through the states accumulating values to sort until we hit the sort threshold
		idx_t unsorted_count = 0;
		idx_t sorted = 0;
		for (idx_t finalized = 0; finalized < count;) {
			if (unsorted_count < order_bind.threshold) {
				auto state = sdata[finalized];
				prefixed.Reset();
				prefixed.data[0].Reference(Value::USMALLINT(UnsafeNumericCast<uint16_t>(finalized)));
				state->Finalize(order_bind, prefixed, *local_sort);
				unsorted_count += state_unprocessed[finalized];

				// Go to the next aggregate unless this is the last one
				if (++finalized < count) {
					continue;
				}
			}

			//	If they were all empty (filtering) flush them
			//	(This can only happen on the last range)
			if (!unsorted_count) {
				break;
			}

			//	Sort all the data
			global_sort->AddLocalState(*local_sort);
			global_sort->PrepareMergePhase();
			while (global_sort->sorted_blocks.size() > 1) {
				global_sort->InitializeMergeRound();
				MergeSorter merge_sorter(*global_sort, global_sort->buffer_manager);
				merge_sorter.PerformInMergeRound();
				global_sort->CompleteMergeRound(false);
			}

			auto scanner = make_uniq<PayloadScanner>(*global_sort);
			initialize(aggr, agg_state.data());
			while (scanner->Remaining()) {
				chunk.Reset();
				scanner->Scan(chunk);
				idx_t consumed = 0;

				// Distribute the scanned chunk to the aggregates
				while (consumed < chunk.size()) {
					//	Find the next aggregate that needs data
					for (; !state_unprocessed[sorted]; ++sorted) {
						// Finalize a single value at the next offset
						agg_state_vec.SetVectorType(states.GetVectorType());
						finalize(agg_state_vec, aggr_bind_info, result, 1, sorted + offset);
						if (destructor) {
							destructor(agg_state_vec, aggr_bind_info, 1);
						}

						initialize(aggr, agg_state.data());
					}
					const auto input_count = MinValue(state_unprocessed[sorted], chunk.size() - consumed);
					for (column_t col_idx = 0; col_idx < chunk.ColumnCount(); ++col_idx) {
						sliced.data[col_idx].Slice(chunk.data[col_idx], consumed, consumed + input_count);
					}
					sliced.SetCardinality(input_count);

					// These are all simple updates, so use it if available
					if (simple_update) {
						simple_update(sliced.data.data(), aggr_bind_info, sliced.data.size(), agg_state.data(),
						              sliced.size());
					} else {
						// We are only updating a constant state
						agg_state_vec.SetVectorType(VectorType::CONSTANT_VECTOR);
						update(sliced.data.data(), aggr_bind_info, sliced.data.size(), agg_state_vec, sliced.size());
					}

					consumed += input_count;
					state_unprocessed[sorted] -= input_count;
				}
			}

			//	Finalize the last state for this sort
			agg_state_vec.SetVectorType(states.GetVectorType());
			finalize(agg_state_vec, aggr_bind_info, result, 1, sorted + offset);
			if (destructor) {
				destructor(agg_state_vec, aggr_bind_info, 1);
			}
			++sorted;

			//	Stop if we are done
			if (finalized >= count) {
				break;
			}

			//	Create a new sort
			scanner.reset();
			global_sort = make_uniq<GlobalSortState>(context, orders, payload_layout);
			global_sort->external = order_bind.external;
			local_sort = make_uniq<LocalSortState>();
			local_sort->Initialize(*global_sort, global_sort->buffer_manager);
			unsorted_count = 0;
		}

		for (; sorted < count; ++sorted) {
			initialize(aggr, agg_state.data());

			// Finalize a single value at the next offset
			agg_state_vec.SetVectorType(states.GetVectorType());
			finalize(agg_state_vec, aggr_bind_info, result, 1, sorted + offset);

			if (destructor) {
				destructor(agg_state_vec, aggr_bind_info, 1);
			}
		}

		result.Verify(count);
	}